

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

Vec_Ptr_t * Saig_ManBmcTerSim(Aig_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint *pInfo;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  uVar8 = 0;
  pInfo = (uint *)0x0;
  uVar9 = 0;
  iVar6 = 1000000000;
  do {
    iVar3 = Saig_ManBmcTerSimCount01(p,pInfo);
    pInfo = Saig_ManBmcTerSimOne(p,pInfo);
    uVar1 = pVVar4->nSize;
    uVar2 = pVVar4->nCap;
    if (uVar1 == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
        }
        iVar7 = 0x10;
      }
      else {
        iVar7 = uVar2 * 2;
        if (iVar7 <= (int)uVar2) goto LAB_0055d772;
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
        }
      }
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = iVar7;
    }
LAB_0055d772:
    pVVar4->nSize = uVar1 + 1;
    pVVar4->pArray[(int)uVar1] = pInfo;
    if (iVar3 < 1) {
      return pVVar4;
    }
    if (0x3e6 < uVar9) {
      return pVVar4;
    }
    uVar8 = uVar8 + (iVar6 <= iVar3);
    uVar9 = uVar9 + 1;
    iVar6 = iVar3;
    if (4 < uVar8) {
      return pVVar4;
    }
  } while( true );
}

Assistant:

Vec_Ptr_t * Saig_ManBmcTerSim( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    unsigned * pInfo = NULL;
    int i, TerPrev = ABC_INFINITY, TerCur, CountIncrease = 0;
    vInfos = Vec_PtrAlloc( 100 );
    for ( i = 0; i < 1000 && CountIncrease < 5 && TerPrev > 0; i++ )
    {
        TerCur = Saig_ManBmcTerSimCount01( p, pInfo );
        if ( TerCur >= TerPrev )
            CountIncrease++;
        TerPrev = TerCur;
        pInfo = Saig_ManBmcTerSimOne( p, pInfo );
        Vec_PtrPush( vInfos, pInfo );
    }
    return vInfos;
}